

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_encoder.cc
# Opt level: O2

bool __thiscall draco::PlyEncoder::EncodeInternal(PlyEncoder *this)

{
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var1;
  pointer paVar2;
  uint uVar3;
  uint uVar4;
  int32_t iVar5;
  ostream *poVar6;
  char *pcVar7;
  uint uVar8;
  Mesh *pMVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  int c;
  int attribute;
  long lVar13;
  PointIndex v;
  ulong uVar14;
  uchar local_1f5;
  uint local_1f4;
  ulong local_1f0;
  uint local_1e4;
  ulong local_1e0;
  string header_str;
  stringstream out;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&out);
  poVar6 = std::operator<<(local_1a8,"ply");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(local_1a8,"format binary_little_endian 1.0");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(local_1a8,"element vertex ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::endl<char,std::char_traits<char>>(poVar6);
  local_1f4 = PointCloud::GetNamedAttributeId(this->in_point_cloud_,POSITION);
  uVar3 = PointCloud::GetNamedAttributeId(this->in_point_cloud_,NORMAL);
  uVar10 = (ulong)uVar3;
  uVar4 = PointCloud::GetNamedAttributeId(this->in_point_cloud_,TEX_COORD);
  iVar5 = PointCloud::GetNamedAttributeId(this->in_point_cloud_,COLOR);
  local_1f0 = CONCAT44(local_1f0._4_4_,iVar5);
  if ((int)local_1f4 < 0) {
    bVar12 = false;
  }
  else {
    if ((-1 < (int)uVar3) &&
       (*(char *)((long)(this->in_point_cloud_->attributes_).
                        super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_t.
                        super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                        ._M_t + 0x18) != '\x03')) {
      uVar10 = 0xffffffff;
    }
    if ((-1 < (int)uVar4) &&
       (*(char *)((long)(this->in_point_cloud_->attributes_).
                        super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t.
                        super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                        ._M_t + 0x18) != '\x02')) {
      uVar4 = 0xffffffff;
    }
    poVar6 = std::operator<<(local_1a8,"property ");
    pcVar7 = GetAttributeDataType(this,local_1f4);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6," x");
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<(local_1a8,"property ");
    pcVar7 = GetAttributeDataType(this,local_1f4);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6," y");
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<(local_1a8,"property ");
    pcVar7 = GetAttributeDataType(this,local_1f4);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6," z");
    std::endl<char,std::char_traits<char>>(poVar6);
    attribute = (int)uVar10;
    if (-1 < attribute) {
      poVar6 = std::operator<<(local_1a8,"property ");
      pcVar7 = GetAttributeDataType(this,attribute);
      poVar6 = std::operator<<(poVar6,pcVar7);
      poVar6 = std::operator<<(poVar6," nx");
      std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<(local_1a8,"property ");
      pcVar7 = GetAttributeDataType(this,attribute);
      poVar6 = std::operator<<(poVar6,pcVar7);
      poVar6 = std::operator<<(poVar6," ny");
      std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<(local_1a8,"property ");
      pcVar7 = GetAttributeDataType(this,attribute);
      poVar6 = std::operator<<(poVar6,pcVar7);
      poVar6 = std::operator<<(poVar6," nz");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    local_1e0 = local_1f0 & 0xffffffff;
    if ((-1 < (int)local_1f0) &&
       (_Var1._M_t.
        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
             (this->in_point_cloud_->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[local_1e0]._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t,
       *(char *)((long)_Var1._M_t.
                       super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                       .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x18)
       != '\0')) {
      poVar6 = std::operator<<(local_1a8,"property ");
      pcVar7 = GetAttributeDataType(this,(int)local_1f0);
      poVar6 = std::operator<<(poVar6,pcVar7);
      poVar6 = std::operator<<(poVar6," red");
      std::endl<char,std::char_traits<char>>(poVar6);
      if (1 < *(byte *)((long)_Var1._M_t.
                              super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                              .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                       0x18)) {
        poVar6 = std::operator<<(local_1a8,"property ");
        pcVar7 = GetAttributeDataType(this,(int)local_1f0);
        poVar6 = std::operator<<(poVar6,pcVar7);
        poVar6 = std::operator<<(poVar6," green");
        std::endl<char,std::char_traits<char>>(poVar6);
        if (2 < *(byte *)((long)_Var1._M_t.
                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl
                         + 0x18)) {
          poVar6 = std::operator<<(local_1a8,"property ");
          pcVar7 = GetAttributeDataType(this,(int)local_1f0);
          poVar6 = std::operator<<(poVar6,pcVar7);
          poVar6 = std::operator<<(poVar6," blue");
          std::endl<char,std::char_traits<char>>(poVar6);
          if (3 < *(byte *)((long)_Var1._M_t.
                                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                  .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                  _M_head_impl + 0x18)) {
            poVar6 = std::operator<<(local_1a8,"property ");
            pcVar7 = GetAttributeDataType(this,(int)local_1f0);
            poVar6 = std::operator<<(poVar6,pcVar7);
            poVar6 = std::operator<<(poVar6," alpha");
            std::endl<char,std::char_traits<char>>(poVar6);
          }
        }
      }
    }
    if (this->in_mesh_ != (Mesh *)0x0) {
      poVar6 = std::operator<<(local_1a8,"element face ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<(local_1a8,"property list uchar int vertex_indices");
      std::endl<char,std::char_traits<char>>(poVar6);
      if (-1 < (int)uVar4) {
        poVar6 = std::operator<<(local_1a8,"property list uchar ");
        pcVar7 = GetAttributeDataType(this,uVar4);
        poVar6 = std::operator<<(poVar6,pcVar7);
        poVar6 = std::operator<<(poVar6," texcoord");
        std::endl<char,std::char_traits<char>>(poVar6);
      }
    }
    poVar6 = std::operator<<(local_1a8,"end_header");
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::stringbuf::str();
    local_1e4 = uVar4;
    EncoderBuffer::Encode(this->out_buffer_,header_str._M_dataplus._M_p,header_str._M_string_length)
    ;
    uVar4 = this->in_point_cloud_->num_points_;
    uVar11 = (ulong)local_1f4;
    for (uVar14 = 0; uVar4 != uVar14; uVar14 = uVar14 + 1) {
      _Var1._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           (this->in_point_cloud_->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t;
      uVar3 = (uint)uVar14;
      uVar8 = uVar3;
      if (*(char *)((long)_Var1._M_t.
                          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 100)
          != '\x01') {
        uVar8 = *(uint *)(*(long *)((long)_Var1._M_t.
                                          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                          .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                          _M_head_impl + 0x48) + uVar14 * 4);
      }
      EncoderBuffer::Encode
                (this->out_buffer_,
                 (void *)((ulong)uVar8 *
                          *(size_t *)
                           ((long)_Var1._M_t.
                                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                  .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                  _M_head_impl + 0x28) +
                          **(long **)_Var1._M_t.
                                     super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                     .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                     _M_head_impl +
                         *(long *)((long)_Var1._M_t.
                                         super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                         .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                         _M_head_impl + 0x30)),
                 *(size_t *)
                  ((long)_Var1._M_t.
                         super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                         .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x28)
                );
      if (-1 < attribute) {
        _Var1._M_t.
        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
             (this->in_point_cloud_->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t;
        uVar8 = uVar3;
        if (*(char *)((long)_Var1._M_t.
                            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                     100) != '\x01') {
          uVar8 = *(uint *)(*(long *)((long)_Var1._M_t.
                                            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                            .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                            _M_head_impl + 0x48) + uVar14 * 4);
        }
        EncoderBuffer::Encode
                  (this->out_buffer_,
                   (void *)((ulong)uVar8 *
                            *(size_t *)
                             ((long)_Var1._M_t.
                                    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                    .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                    _M_head_impl + 0x28) +
                            **(long **)_Var1._M_t.
                                       super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                       .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                       _M_head_impl +
                           *(long *)((long)_Var1._M_t.
                                           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                           .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                           _M_head_impl + 0x30)),
                   *(size_t *)
                    ((long)_Var1._M_t.
                           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                           .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                    0x28));
      }
      if (-1 < (int)local_1f0) {
        _Var1._M_t.
        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
             (this->in_point_cloud_->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[local_1e0]._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t;
        if (*(char *)((long)_Var1._M_t.
                            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                     100) != '\x01') {
          uVar3 = *(uint *)(*(long *)((long)_Var1._M_t.
                                            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                            .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                            _M_head_impl + 0x48) + uVar14 * 4);
        }
        EncoderBuffer::Encode
                  (this->out_buffer_,
                   (void *)((ulong)uVar3 *
                            *(size_t *)
                             ((long)_Var1._M_t.
                                    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                    .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                    _M_head_impl + 0x28) +
                            **(long **)_Var1._M_t.
                                       super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                       .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                       _M_head_impl +
                           *(long *)((long)_Var1._M_t.
                                           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                           .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                           _M_head_impl + 0x30)),
                   *(size_t *)
                    ((long)_Var1._M_t.
                           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                           .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                    0x28));
      }
    }
    pMVar9 = this->in_mesh_;
    bVar12 = true;
    if (pMVar9 != (Mesh *)0x0) {
      local_1e0 = (ulong)local_1e4;
      uVar11 = 0;
      for (uVar10 = 0;
          uVar10 < (((long)(pMVar9->faces_).vector_.
                           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pMVar9->faces_).vector_.
                          super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc & 0xffffffffU);
          uVar10 = uVar10 + 1) {
        local_1f5 = '\x03';
        EncoderBuffer::Encode<unsigned_char>(this->out_buffer_,&local_1f5);
        paVar2 = (this->in_mesh_->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (lVar13 = 0; lVar13 != 0xc; lVar13 = lVar13 + 4) {
          if (uVar4 <= *(uint *)((long)&paVar2->_M_elems[0].value_ + lVar13 + uVar11)) {
            bVar12 = false;
            goto LAB_0011599d;
          }
          EncoderBuffer::Encode<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>
                    (this->out_buffer_,
                     (IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)
                     ((long)&paVar2->_M_elems[0].value_ + lVar13 + uVar11));
        }
        local_1f0 = uVar11;
        if (-1 < (int)local_1e4) {
          local_1f5 = '\x06';
          EncoderBuffer::Encode<unsigned_char>(this->out_buffer_,&local_1f5);
          _Var1._M_t.
          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
               (this->in_point_cloud_->attributes_).
               super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_1e0]._M_t.
               super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
               ._M_t;
          for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
            uVar3 = *(uint *)((long)(paVar2->_M_elems + lVar13) + uVar11);
            if (*(char *)((long)_Var1._M_t.
                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl
                         + 100) == '\0') {
              uVar3 = *(uint *)(*(long *)((long)_Var1._M_t.
                                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                                .
                                                super__Head_base<0UL,_draco::PointAttribute_*,_false>
                                                ._M_head_impl + 0x48) + (ulong)uVar3 * 4);
            }
            EncoderBuffer::Encode
                      (this->out_buffer_,
                       (void *)((ulong)uVar3 *
                                *(size_t *)
                                 ((long)_Var1._M_t.
                                        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                        .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                        _M_head_impl + 0x28) +
                                **(long **)_Var1._M_t.
                                           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                           .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                           _M_head_impl +
                               *(long *)((long)_Var1._M_t.
                                               super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                               .
                                               super__Head_base<0UL,_draco::PointAttribute_*,_false>
                                               ._M_head_impl + 0x30)),
                       *(size_t *)
                        ((long)_Var1._M_t.
                               super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                               .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                        0x28));
          }
        }
        pMVar9 = this->in_mesh_;
        uVar11 = local_1f0 + 0xc;
      }
      bVar12 = true;
    }
LAB_0011599d:
    std::__cxx11::string::~string((string *)&header_str);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return bVar12;
}

Assistant:

bool PlyEncoder::EncodeInternal() {
  // Write PLY header.
  // TODO(ostava): Currently works only for xyz positions and rgb(a) colors.
  std::stringstream out;
  out << "ply" << std::endl;
  out << "format binary_little_endian 1.0" << std::endl;
  out << "element vertex " << in_point_cloud_->num_points() << std::endl;

  const int pos_att_id =
      in_point_cloud_->GetNamedAttributeId(GeometryAttribute::POSITION);
  int normal_att_id =
      in_point_cloud_->GetNamedAttributeId(GeometryAttribute::NORMAL);
  int tex_coord_att_id =
      in_point_cloud_->GetNamedAttributeId(GeometryAttribute::TEX_COORD);
  const int color_att_id =
      in_point_cloud_->GetNamedAttributeId(GeometryAttribute::COLOR);

  if (pos_att_id < 0) {
    return false;
  }

  // Ensure normals are 3 component. Don't encode them otherwise.
  if (normal_att_id >= 0 &&
      in_point_cloud_->attribute(normal_att_id)->num_components() != 3) {
    normal_att_id = -1;
  }

  // Ensure texture coordinates have only 2 components. Don't encode them
  // otherwise. TODO(ostava): Add support for 3 component normals (uvw).
  if (tex_coord_att_id >= 0 &&
      in_point_cloud_->attribute(tex_coord_att_id)->num_components() != 2) {
    tex_coord_att_id = -1;
  }

  out << "property " << GetAttributeDataType(pos_att_id) << " x" << std::endl;
  out << "property " << GetAttributeDataType(pos_att_id) << " y" << std::endl;
  out << "property " << GetAttributeDataType(pos_att_id) << " z" << std::endl;
  if (normal_att_id >= 0) {
    out << "property " << GetAttributeDataType(normal_att_id) << " nx"
        << std::endl;
    out << "property " << GetAttributeDataType(normal_att_id) << " ny"
        << std::endl;
    out << "property " << GetAttributeDataType(normal_att_id) << " nz"
        << std::endl;
  }
  if (color_att_id >= 0) {
    const auto *const attribute = in_point_cloud_->attribute(color_att_id);
    if (attribute->num_components() > 0) {
      out << "property " << GetAttributeDataType(color_att_id) << " red"
          << std::endl;
    }
    if (attribute->num_components() > 1) {
      out << "property " << GetAttributeDataType(color_att_id) << " green"
          << std::endl;
    }
    if (attribute->num_components() > 2) {
      out << "property " << GetAttributeDataType(color_att_id) << " blue"
          << std::endl;
    }
    if (attribute->num_components() > 3) {
      out << "property " << GetAttributeDataType(color_att_id) << " alpha"
          << std::endl;
    }
  }
  if (in_mesh_) {
    out << "element face " << in_mesh_->num_faces() << std::endl;
    out << "property list uchar int vertex_indices" << std::endl;
    if (tex_coord_att_id >= 0) {
      // Texture coordinates are usually encoded in the property list (one value
      // per corner).
      out << "property list uchar " << GetAttributeDataType(tex_coord_att_id)
          << " texcoord" << std::endl;
    }
  }
  out << "end_header" << std::endl;

  // Not very efficient but the header should be small so just copy the stream
  // to a string.
  const std::string header_str = out.str();
  buffer()->Encode(header_str.data(), header_str.length());

  // Store point attributes.
  const int num_points = in_point_cloud_->num_points();
  for (PointIndex v(0); v < num_points; ++v) {
    const auto *const pos_att = in_point_cloud_->attribute(pos_att_id);
    buffer()->Encode(pos_att->GetAddress(pos_att->mapped_index(v)),
                     pos_att->byte_stride());
    if (normal_att_id >= 0) {
      const auto *const normal_att = in_point_cloud_->attribute(normal_att_id);
      buffer()->Encode(normal_att->GetAddress(normal_att->mapped_index(v)),
                       normal_att->byte_stride());
    }
    if (color_att_id >= 0) {
      const auto *const color_att = in_point_cloud_->attribute(color_att_id);
      buffer()->Encode(color_att->GetAddress(color_att->mapped_index(v)),
                       color_att->byte_stride());
    }
  }

  if (in_mesh_) {
    // Write face data.
    for (FaceIndex i(0); i < in_mesh_->num_faces(); ++i) {
      // Write the number of face indices (always 3).
      buffer()->Encode(static_cast<uint8_t>(3));

      const auto &f = in_mesh_->face(i);
      for (int c = 0; c < 3; ++c) {
        if (f[c] >= num_points) {
          // Invalid point stored on the |in_mesh_| face.
          return false;
        }
        buffer()->Encode(f[c]);
      }

      if (tex_coord_att_id >= 0) {
        // Two coordinates for every corner -> 6.
        buffer()->Encode(static_cast<uint8_t>(6));

        const auto *const tex_att =
            in_point_cloud_->attribute(tex_coord_att_id);
        for (int c = 0; c < 3; ++c) {
          buffer()->Encode(tex_att->GetAddress(tex_att->mapped_index(f[c])),
                           tex_att->byte_stride());
        }
      }
    }
  }
  return true;
}